

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiGetIRCHKSourceXY(ndicapi *pol,int side,int i,double *xy)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  char *cp;
  
  iVar2 = 2;
  if (pol->IrchkSources[0] != '\0') {
    cp = pol->IrchkSources;
    lVar1 = ndiSignedToLong(cp,3);
    uVar3 = (uint)lVar1;
    if (uVar3 < 0x15) {
      lVar1 = ndiSignedToLong(pol->IrchkSources + (ulong)(uVar3 * 6) + 3,3);
      if ((uint)lVar1 < 0x15) {
        if (side == 1) {
          if ((uint)lVar1 <= (uint)i) {
            return 2;
          }
          cp = cp + (ulong)(i * 6 + uVar3 * 6) + 6;
        }
        else if (side == 0) {
          if (uVar3 <= (uint)i) {
            return 2;
          }
          cp = cp + (ulong)(uint)(i * 6) + 3;
        }
        lVar1 = ndiSignedToLong(cp,3);
        *xy = (double)lVar1 * 0.01;
        lVar1 = ndiSignedToLong(cp + 3,3);
        xy[1] = (double)lVar1 * 0.01;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

ndicapiExport int ndiGetIRCHKSourceXY(ndicapi* pol, int side, int i, double xy[2])
{
  const char* dp;
  int n, m;

  dp = pol->IrchkSources;

  if (dp == NULL || *dp == '\0')
  {
    return NDI_MISSING;
  }

  n = (int)ndiSignedToLong(dp, 3);
  if (n < 0 || n > 20)
  {
    return NDI_MISSING;
  }
  m = (int)ndiSignedToLong(dp + 3 + 2 * 3 * n, 3);
  if (m < 0 || m > 20)
  {
    return NDI_MISSING;
  }

  if (side == NDI_LEFT)
  {
    if (i < 0 || i >= n)
    {
      return NDI_MISSING;
    }
    dp += 3 + 2 * 3 * i;
  }
  else if (side == NDI_RIGHT)
  {
    if (i < 0 || i >= m)
    {
      return NDI_MISSING;
    }
    dp += 3 + 2 * 3 * n + 3 + 2 * 3 * i;
  }
  else if (side == NDI_RIGHT)
  {
    return NDI_MISSING;
  }

  xy[0] = ndiSignedToLong(&dp[0], 3) * 0.01;
  xy[1] = ndiSignedToLong(&dp[3], 3) * 0.01;

  return NDI_OKAY;
}